

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O1

int16_t __thiscall kaitai::kstream::read_s2be(kstream *this)

{
  int16_t t;
  ushort local_a;
  
  std::istream::read((char *)this->m_io,(long)&local_a);
  return local_a << 8 | local_a >> 8;
}

Assistant:

int16_t kaitai::kstream::read_s2be() {
    int16_t t;
    m_io->read(reinterpret_cast<char *>(&t), 2);
#if __BYTE_ORDER == __LITTLE_ENDIAN
    t = bswap_16(t);
#endif
    return t;
}